

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

tuple<mjs::token_type,_int> mjs::anon_unknown_2::get_punctuation(wstring_view s,version v)

{
  _Tuple_impl<0UL,_mjs::token_type,_int> _Var1;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_00;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_01;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_02;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_03;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_04;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_05;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_06;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_07;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_08;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_09;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_10;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_11;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_12;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_13;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_14;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_15;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_16;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_17;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_18;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_19;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_20;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_21;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_22;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_23;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_24;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_25;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_26;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_27;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_28;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_29;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_30;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_31;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_32;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_33;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_34;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_35;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_36;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_37;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_38;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_39;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_40;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_41;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_42;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_43;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_44;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_45;
  _Head_base<0UL,_mjs::token_type,_false> extraout_var_46;
  ostream *poVar2;
  runtime_error *this;
  int in_ECX;
  undefined4 in_register_00000014;
  wstring_view *s_00;
  undefined8 uVar3;
  wstring qs;
  ostringstream oss;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_1e8;
  wchar_t *local_1d8;
  wchar_t *local_1d0;
  long local_1c8 [2];
  wstring local_1b8;
  ostringstream local_198 [376];
  _Head_base<0UL,_mjs::token_type,_false> extraout_var;
  
  local_1e8._M_str = (wchar_t *)CONCAT44(in_register_00000014,v);
  local_1e8._M_len = (size_t)s._M_str;
  if ((wchar_t *)local_1e8._M_len == (wchar_t *)0x0) {
    __assert_fail("!s.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x7c,
                  "std::tuple<token_type, int> mjs::(anonymous namespace)::get_punctuation(std::wstring_view, version)"
                 );
  }
  if (-1 < in_ECX) {
    if ((wchar_t *)0x3 < local_1e8._M_len) {
      _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)
           std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                     (&local_1e8,0,4,L">>>=");
      _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl = extraout_var._M_head_impl;
      if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
        uVar3 = 0x500000004;
        goto LAB_00182d98;
      }
    }
    if ((wchar_t *)0x2 < local_1e8._M_len) {
      _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)
           std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                     (&local_1e8,0,3,L">>>");
      _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
           extraout_var_00._M_head_impl;
      if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
        uVar3 = 0x600000003;
        goto LAB_00182d98;
      }
      if ((wchar_t *)0x2 < local_1e8._M_len) {
        _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)
             std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                       (&local_1e8,0,3,L"<<=");
        _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
             extraout_var_01._M_head_impl;
        if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
          uVar3 = 0x700000003;
          goto LAB_00182d98;
        }
        if ((wchar_t *)0x2 < local_1e8._M_len) {
          _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)
               std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                         (&local_1e8,0,3,L">>=");
          _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
               extraout_var_02._M_head_impl;
          if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0)
          {
            uVar3 = 0x800000003;
            goto LAB_00182d98;
          }
        }
      }
    }
    if ((in_ECX != 0) && ((wchar_t *)0x2 < local_1e8._M_len)) {
      _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)
           std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                     (&local_1e8,0,3,L"===");
      _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
           extraout_var_03._M_head_impl;
      if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
        uVar3 = 0x900000003;
        goto LAB_00182d98;
      }
      if ((wchar_t *)0x2 < local_1e8._M_len) {
        _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)
             std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                       (&local_1e8,0,3,L"!==");
        _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
             extraout_var_04._M_head_impl;
        if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
          uVar3 = 0xa00000003;
          goto LAB_00182d98;
        }
      }
    }
    if ((wchar_t *)0x1 < local_1e8._M_len) {
      _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)
           std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                     (&local_1e8,0,2,L"==");
      _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
           extraout_var_05._M_head_impl;
      if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
        uVar3 = 0xb00000002;
        goto LAB_00182d98;
      }
      if ((wchar_t *)0x1 < local_1e8._M_len) {
        _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)
             std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                       (&local_1e8,0,2,L"!=");
        _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
             extraout_var_06._M_head_impl;
        if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
          uVar3 = 0xc00000002;
          goto LAB_00182d98;
        }
        if ((wchar_t *)0x1 < local_1e8._M_len) {
          _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)
               std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                         (&local_1e8,0,2,L"<=");
          _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
               extraout_var_07._M_head_impl;
          if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0)
          {
            uVar3 = 0xd00000002;
            goto LAB_00182d98;
          }
          if ((wchar_t *)0x1 < local_1e8._M_len) {
            _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 (_Head_base<1UL,_int,_false>)
                 std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                           (&local_1e8,0,2,L">=");
            _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                 extraout_var_08._M_head_impl;
            if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl ==
                0) {
              uVar3 = 0xe00000002;
              goto LAB_00182d98;
            }
            if ((wchar_t *)0x1 < local_1e8._M_len) {
              _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   (_Head_base<1UL,_int,_false>)
                   std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                             (&local_1e8,0,2,L"&&");
              _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                   extraout_var_09._M_head_impl;
              if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                  == 0) {
                uVar3 = 0xf00000002;
                goto LAB_00182d98;
              }
              if ((wchar_t *)0x1 < local_1e8._M_len) {
                _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                     (_Head_base<1UL,_int,_false>)
                     std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                               (&local_1e8,0,2,L"||");
                _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                     extraout_var_10._M_head_impl;
                if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                    == 0) {
                  uVar3 = 0x1000000002;
                  goto LAB_00182d98;
                }
                if ((wchar_t *)0x1 < local_1e8._M_len) {
                  _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                       (_Head_base<1UL,_int,_false>)
                       std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                 (&local_1e8,0,2,L"++");
                  _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                       extraout_var_11._M_head_impl;
                  if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl == 0) {
                    uVar3 = 0x1100000002;
                    goto LAB_00182d98;
                  }
                  if ((wchar_t *)0x1 < local_1e8._M_len) {
                    _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                         = (_Head_base<1UL,_int,_false>)
                           std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                     (&local_1e8,0,2,L"--");
                    _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                         extraout_var_12._M_head_impl;
                    if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl == 0) {
                      uVar3 = 0x1200000002;
                      goto LAB_00182d98;
                    }
                    if ((wchar_t *)0x1 < local_1e8._M_len) {
                      _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl = (_Head_base<1UL,_int,_false>)
                                     std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                     compare(&local_1e8,0,2,L"<<");
                      _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                           extraout_var_13._M_head_impl;
                      if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                          _M_head_impl == 0) {
                        uVar3 = 0x1300000002;
                        goto LAB_00182d98;
                      }
                      if ((wchar_t *)0x1 < local_1e8._M_len) {
                        _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl = (_Head_base<1UL,_int,_false>)
                                       std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                       compare(&local_1e8,0,2,L">>");
                        _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                             extraout_var_14._M_head_impl;
                        if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                            _M_head_impl == 0) {
                          uVar3 = 0x1400000002;
                          goto LAB_00182d98;
                        }
                        if ((wchar_t *)0x1 < local_1e8._M_len) {
                          _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                          _M_head_impl = (_Head_base<1UL,_int,_false>)
                                         std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                         ::compare(&local_1e8,0,2,L"+=");
                          _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                               extraout_var_15._M_head_impl;
                          if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                              _M_head_impl == 0) {
                            uVar3 = 0x1500000002;
                            goto LAB_00182d98;
                          }
                          if ((wchar_t *)0x1 < local_1e8._M_len) {
                            _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                            _M_head_impl = (_Head_base<1UL,_int,_false>)
                                           std::
                                           basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                           compare(&local_1e8,0,2,L"-=");
                            _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                                 extraout_var_16._M_head_impl;
                            if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                                _M_head_impl == 0) {
                              uVar3 = 0x1600000002;
                              goto LAB_00182d98;
                            }
                            if ((wchar_t *)0x1 < local_1e8._M_len) {
                              _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                              _M_head_impl = (_Head_base<1UL,_int,_false>)
                                             std::
                                             basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                             ::compare(&local_1e8,0,2,L"*=");
                              _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                                   extraout_var_17._M_head_impl;
                              if (_Var1.super__Tuple_impl<1UL,_int>.
                                  super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                uVar3 = 0x1700000002;
                                goto LAB_00182d98;
                              }
                              if ((wchar_t *)0x1 < local_1e8._M_len) {
                                _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                                _M_head_impl = (_Head_base<1UL,_int,_false>)
                                               std::
                                               basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                               ::compare(&local_1e8,0,2,L"/=");
                                _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                                     extraout_var_18._M_head_impl;
                                if (_Var1.super__Tuple_impl<1UL,_int>.
                                    super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                  uVar3 = 0x1800000002;
                                  goto LAB_00182d98;
                                }
                                if ((wchar_t *)0x1 < local_1e8._M_len) {
                                  _Var1.super__Tuple_impl<1UL,_int>.
                                  super__Head_base<1UL,_int,_false>._M_head_impl =
                                       (_Head_base<1UL,_int,_false>)
                                       std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                       compare(&local_1e8,0,2,L"&=");
                                  _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                                       extraout_var_19._M_head_impl;
                                  if (_Var1.super__Tuple_impl<1UL,_int>.
                                      super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                    uVar3 = 0x1900000002;
                                    goto LAB_00182d98;
                                  }
                                  if ((wchar_t *)0x1 < local_1e8._M_len) {
                                    _Var1.super__Tuple_impl<1UL,_int>.
                                    super__Head_base<1UL,_int,_false>._M_head_impl =
                                         (_Head_base<1UL,_int,_false>)
                                         std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                         ::compare(&local_1e8,0,2,L"|=");
                                    _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl
                                         = extraout_var_20._M_head_impl;
                                    if (_Var1.super__Tuple_impl<1UL,_int>.
                                        super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                      uVar3 = 0x1a00000002;
                                      goto LAB_00182d98;
                                    }
                                    if ((wchar_t *)0x1 < local_1e8._M_len) {
                                      _Var1.super__Tuple_impl<1UL,_int>.
                                      super__Head_base<1UL,_int,_false>._M_head_impl =
                                           (_Head_base<1UL,_int,_false>)
                                           std::
                                           basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                           compare(&local_1e8,0,2,L"^=");
                                      _Var1.super__Head_base<0UL,_mjs::token_type,_false>.
                                      _M_head_impl = extraout_var_21._M_head_impl;
                                      if (_Var1.super__Tuple_impl<1UL,_int>.
                                          super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                        uVar3 = 0x1b00000002;
                                        goto LAB_00182d98;
                                      }
                                      if ((wchar_t *)0x1 < local_1e8._M_len) {
                                        _Var1.super__Tuple_impl<1UL,_int>.
                                        super__Head_base<1UL,_int,_false>._M_head_impl =
                                             (_Head_base<1UL,_int,_false>)
                                             std::
                                             basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                             ::compare(&local_1e8,0,2,L"%=");
                                        _Var1.super__Head_base<0UL,_mjs::token_type,_false>.
                                        _M_head_impl = extraout_var_22._M_head_impl;
                                        if (_Var1.super__Tuple_impl<1UL,_int>.
                                            super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                          uVar3 = 0x1c00000002;
                                          goto LAB_00182d98;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)
           std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare(&local_1e8,0,1,L"=")
      ;
      _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
           extraout_var_23._M_head_impl;
      if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
        uVar3 = 0x1d00000001;
LAB_00182d98:
        *(undefined8 *)s._M_len = uVar3;
        return (tuple<mjs::token_type,_int>)_Var1;
      }
      if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
        _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)
             std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                       (&local_1e8,0,1,L">");
        _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
             extraout_var_24._M_head_impl;
        if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
          uVar3 = 0x1e00000001;
          goto LAB_00182d98;
        }
        if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
          _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)
               std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                         (&local_1e8,0,1,L"<");
          _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
               extraout_var_25._M_head_impl;
          if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl == 0)
          {
            uVar3 = 0x1f00000001;
            goto LAB_00182d98;
          }
          if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
            _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 (_Head_base<1UL,_int,_false>)
                 std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                           (&local_1e8,0,1,L",");
            _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                 extraout_var_26._M_head_impl;
            if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl ==
                0) {
              uVar3 = 0x2000000001;
              goto LAB_00182d98;
            }
            if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
              _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   (_Head_base<1UL,_int,_false>)
                   std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                             (&local_1e8,0,1,L"!");
              _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                   extraout_var_27._M_head_impl;
              if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                  == 0) {
                uVar3 = 0x2100000001;
                goto LAB_00182d98;
              }
              if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                     (_Head_base<1UL,_int,_false>)
                     std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                               (&local_1e8,0,1,L"~");
                _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                     extraout_var_28._M_head_impl;
                if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                    == 0) {
                  uVar3 = 0x2200000001;
                  goto LAB_00182d98;
                }
                if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                  _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                       (_Head_base<1UL,_int,_false>)
                       std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                 (&local_1e8,0,1,L"?");
                  _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                       extraout_var_29._M_head_impl;
                  if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl == 0) {
                    uVar3 = 0x2300000001;
                    goto LAB_00182d98;
                  }
                  if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                    _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                         = (_Head_base<1UL,_int,_false>)
                           std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                     (&local_1e8,0,1,L":");
                    _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                         extraout_var_30._M_head_impl;
                    if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl == 0) {
                      uVar3 = 0x2400000001;
                      goto LAB_00182d98;
                    }
                    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                      _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl = (_Head_base<1UL,_int,_false>)
                                     std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                     compare(&local_1e8,0,1,L".");
                      _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                           extraout_var_31._M_head_impl;
                      if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                          _M_head_impl == 0) {
                        uVar3 = 0x2500000001;
                        goto LAB_00182d98;
                      }
                      if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                        _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl = (_Head_base<1UL,_int,_false>)
                                       std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                       compare(&local_1e8,0,1,L"+");
                        _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                             extraout_var_32._M_head_impl;
                        if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                            _M_head_impl == 0) {
                          uVar3 = 0x2600000001;
                          goto LAB_00182d98;
                        }
                        if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                          _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                          _M_head_impl = (_Head_base<1UL,_int,_false>)
                                         std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                         ::compare(&local_1e8,0,1,L"-");
                          _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                               extraout_var_33._M_head_impl;
                          if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                              _M_head_impl == 0) {
                            uVar3 = 0x2700000001;
                            goto LAB_00182d98;
                          }
                          if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                            _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                            _M_head_impl = (_Head_base<1UL,_int,_false>)
                                           std::
                                           basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                           compare(&local_1e8,0,1,L"*");
                            _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                                 extraout_var_34._M_head_impl;
                            if (_Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                                _M_head_impl == 0) {
                              uVar3 = 0x2800000001;
                              goto LAB_00182d98;
                            }
                            if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                              _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                              _M_head_impl = (_Head_base<1UL,_int,_false>)
                                             std::
                                             basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                             ::compare(&local_1e8,0,1,L"/");
                              _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                                   extraout_var_35._M_head_impl;
                              if (_Var1.super__Tuple_impl<1UL,_int>.
                                  super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                uVar3 = 0x2900000001;
                                goto LAB_00182d98;
                              }
                              if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                                _M_head_impl = (_Head_base<1UL,_int,_false>)
                                               std::
                                               basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                               ::compare(&local_1e8,0,1,L"&");
                                _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                                     extraout_var_36._M_head_impl;
                                if (_Var1.super__Tuple_impl<1UL,_int>.
                                    super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                  uVar3 = 0x2a00000001;
                                  goto LAB_00182d98;
                                }
                                if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                  _Var1.super__Tuple_impl<1UL,_int>.
                                  super__Head_base<1UL,_int,_false>._M_head_impl =
                                       (_Head_base<1UL,_int,_false>)
                                       std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                       compare(&local_1e8,0,1,L"|");
                                  _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl =
                                       extraout_var_37._M_head_impl;
                                  if (_Var1.super__Tuple_impl<1UL,_int>.
                                      super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                    uVar3 = 0x2b00000001;
                                    goto LAB_00182d98;
                                  }
                                  if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                    _Var1.super__Tuple_impl<1UL,_int>.
                                    super__Head_base<1UL,_int,_false>._M_head_impl =
                                         (_Head_base<1UL,_int,_false>)
                                         std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                         ::compare(&local_1e8,0,1,L"^");
                                    _Var1.super__Head_base<0UL,_mjs::token_type,_false>._M_head_impl
                                         = extraout_var_38._M_head_impl;
                                    if (_Var1.super__Tuple_impl<1UL,_int>.
                                        super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                      uVar3 = 0x2c00000001;
                                      goto LAB_00182d98;
                                    }
                                    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                      _Var1.super__Tuple_impl<1UL,_int>.
                                      super__Head_base<1UL,_int,_false>._M_head_impl =
                                           (_Head_base<1UL,_int,_false>)
                                           std::
                                           basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                           compare(&local_1e8,0,1,L"%");
                                      _Var1.super__Head_base<0UL,_mjs::token_type,_false>.
                                      _M_head_impl = extraout_var_39._M_head_impl;
                                      if (_Var1.super__Tuple_impl<1UL,_int>.
                                          super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                        uVar3 = 0x2d00000001;
                                        goto LAB_00182d98;
                                      }
                                      if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                        _Var1.super__Tuple_impl<1UL,_int>.
                                        super__Head_base<1UL,_int,_false>._M_head_impl =
                                             (_Head_base<1UL,_int,_false>)
                                             std::
                                             basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                             ::compare(&local_1e8,0,1,L"(");
                                        _Var1.super__Head_base<0UL,_mjs::token_type,_false>.
                                        _M_head_impl = extraout_var_40._M_head_impl;
                                        if (_Var1.super__Tuple_impl<1UL,_int>.
                                            super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                          uVar3 = 0x2e00000001;
                                          goto LAB_00182d98;
                                        }
                                        if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                          _Var1.super__Tuple_impl<1UL,_int>.
                                          super__Head_base<1UL,_int,_false>._M_head_impl =
                                               (_Head_base<1UL,_int,_false>)
                                               std::
                                               basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                               ::compare(&local_1e8,0,1,L")");
                                          _Var1.super__Head_base<0UL,_mjs::token_type,_false>.
                                          _M_head_impl = extraout_var_41._M_head_impl;
                                          if (_Var1.super__Tuple_impl<1UL,_int>.
                                              super__Head_base<1UL,_int,_false>._M_head_impl == 0) {
                                            uVar3 = 0x2f00000001;
                                            goto LAB_00182d98;
                                          }
                                          if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                            _Var1.super__Tuple_impl<1UL,_int>.
                                            super__Head_base<1UL,_int,_false>._M_head_impl =
                                                 (_Head_base<1UL,_int,_false>)
                                                 std::
                                                 basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                 ::compare(&local_1e8,0,1,L"{");
                                            _Var1.super__Head_base<0UL,_mjs::token_type,_false>.
                                            _M_head_impl = extraout_var_42._M_head_impl;
                                            if (_Var1.super__Tuple_impl<1UL,_int>.
                                                super__Head_base<1UL,_int,_false>._M_head_impl == 0)
                                            {
                                              uVar3 = 0x3000000001;
                                              goto LAB_00182d98;
                                            }
                                            if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                              _Var1.super__Tuple_impl<1UL,_int>.
                                              super__Head_base<1UL,_int,_false>._M_head_impl =
                                                   (_Head_base<1UL,_int,_false>)
                                                   std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare(&local_1e8,0,1,L"}");
                                              _Var1.super__Head_base<0UL,_mjs::token_type,_false>.
                                              _M_head_impl = extraout_var_43._M_head_impl;
                                              if (_Var1.super__Tuple_impl<1UL,_int>.
                                                  super__Head_base<1UL,_int,_false>._M_head_impl ==
                                                  0) {
                                                uVar3 = 0x3100000001;
                                                goto LAB_00182d98;
                                              }
                                              if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                                _Var1.super__Tuple_impl<1UL,_int>.
                                                super__Head_base<1UL,_int,_false>._M_head_impl =
                                                     (_Head_base<1UL,_int,_false>)
                                                     std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare(&local_1e8,0,1,L"[");
                                                _Var1.super__Head_base<0UL,_mjs::token_type,_false>.
                                                _M_head_impl = extraout_var_44._M_head_impl;
                                                if (_Var1.super__Tuple_impl<1UL,_int>.
                                                    super__Head_base<1UL,_int,_false>._M_head_impl
                                                    == 0) {
                                                  uVar3 = 0x3200000001;
                                                  goto LAB_00182d98;
                                                }
                                                if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
                                                  _Var1.super__Tuple_impl<1UL,_int>.
                                                  super__Head_base<1UL,_int,_false>._M_head_impl =
                                                       (_Head_base<1UL,_int,_false>)
                                                       std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare(&local_1e8,0,1,L"]");
                                                  _Var1.
                                                  super__Head_base<0UL,_mjs::token_type,_false>.
                                                  _M_head_impl = extraout_var_45._M_head_impl;
                                                  if (_Var1.super__Tuple_impl<1UL,_int>.
                                                      super__Head_base<1UL,_int,_false>._M_head_impl
                                                      == 0) {
                                                    uVar3 = 0x3300000001;
                                                    goto LAB_00182d98;
                                                  }
                                                  if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0)
                                                  {
                                                    _Var1.super__Tuple_impl<1UL,_int>.
                                                    super__Head_base<1UL,_int,_false>._M_head_impl =
                                                         (_Head_base<1UL,_int,_false>)
                                                         std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare(&local_1e8,0,1,L";");
                                                  _Var1.
                                                  super__Head_base<0UL,_mjs::token_type,_false>.
                                                  _M_head_impl = extraout_var_46._M_head_impl;
                                                  if (_Var1.super__Tuple_impl<1UL,_int>.
                                                      super__Head_base<1UL,_int,_false>._M_head_impl
                                                      == 0) {
                                                    uVar3 = 0x3400000001;
                                                    goto LAB_00182d98;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1d8 = (wchar_t *)0x4;
  if (local_1e8._M_len < (wchar_t *)0x4) {
    local_1d8 = (wchar_t *)local_1e8._M_len;
  }
  local_1d0 = local_1e8._M_str;
  cpp_quote_abi_cxx11_(&local_1b8,(mjs *)&local_1d8,s_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Unhandled character(s) in ",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"get_punctuation",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,": ",2);
  local_1d8 = (wchar_t *)local_1c8;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
            ((string *)&local_1d8,local_1b8._M_dataplus._M_p,
             local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_1d8,(long)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_1d8 != (wchar_t *)local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)&local_1d8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::tuple<token_type, int> get_punctuation(std::wstring_view s, version v) {
    assert(!s.empty());

#define CHECK_PUNCTUATORS(name, str, ver) if (v >= version::ver && s.length() >= sizeof(str)-1 && s.compare(0, sizeof(str)-1, L##str) == 0) return std::pair<token_type, int>{token_type::name, static_cast<int>(sizeof(str)-1)};
    MJS_PUNCTUATORS(CHECK_PUNCTUATORS)
#undef CHECK_PUNCTUATORS

        std::ostringstream oss;
    auto qs = cpp_quote(s.substr(0, s.length() < 4 ? s.length() : 4));
    oss << "Unhandled character(s) in " << __FUNCTION__ << ": " << std::string(qs.begin(), qs.end()) << "\n";
    throw std::runtime_error(oss.str());
}